

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n2builder.cpp
# Opt level: O0

UBool __thiscall
icu_63::Normalizer2DataBuilder::mappingHasCompBoundaryAfter
          (Normalizer2DataBuilder *this,BuilderReorderingBuffer *buffer,MappingType mappingType)

{
  UBool UVar1;
  byte bVar2;
  uint8_t uVar3;
  int32_t i_00;
  int32_t iVar4;
  int i_01;
  UChar32 UVar5;
  UChar32 c_00;
  Norm *pNVar6;
  bool bVar7;
  byte local_41;
  UChar32 c_1;
  uint8_t cc;
  uint8_t prevCC;
  Norm *starterNorm;
  UChar32 c;
  int32_t i;
  UChar32 starter;
  int32_t lastIndex;
  int32_t lastStarterIndex;
  MappingType mappingType_local;
  BuilderReorderingBuffer *buffer_local;
  Normalizer2DataBuilder *this_local;
  
  UVar1 = BuilderReorderingBuffer::isEmpty(buffer);
  if (UVar1 != '\0') {
    return '\0';
  }
  i_00 = BuilderReorderingBuffer::lastStarterIndex(buffer);
  if (i_00 < 0) {
    return '\0';
  }
  iVar4 = BuilderReorderingBuffer::length(buffer);
  i_01 = iVar4 + -1;
  if (((mappingType == ONE_WAY) && (i_00 < i_01)) &&
     (bVar2 = BuilderReorderingBuffer::ccAt(buffer,i_01), 1 < bVar2)) {
    return '\0';
  }
  c = BuilderReorderingBuffer::charAt(buffer,i_00);
  if ((i_00 == 0) && (UVar1 = Norms::combinesBack(&this->norms,c), UVar1 != '\0')) {
    return '\0';
  }
  UVar1 = Hangul::isJamoL(c);
  if (UVar1 == '\0') {
    UVar1 = Hangul::isJamoV(c);
    starterNorm._4_4_ = i_00;
    if ((UVar1 != '\0') && (0 < i_00)) {
      UVar5 = BuilderReorderingBuffer::charAt(buffer,i_00 + -1);
      UVar1 = Hangul::isJamoL(UVar5);
      if (UVar1 != '\0') goto LAB_0020299d;
    }
    while( true ) {
      bVar7 = false;
      if (0 < starterNorm._4_4_) {
        uVar3 = BuilderReorderingBuffer::ccAt(buffer,starterNorm._4_4_ + -1);
        bVar7 = false;
        if (uVar3 == '\0') {
          starterNorm._0_4_ = BuilderReorderingBuffer::charAt(buffer,starterNorm._4_4_ + -1);
          UVar1 = Hangul::isJamo((UChar32)starterNorm);
          bVar7 = UVar1 == '\0';
        }
      }
      if (!bVar7) break;
      c = (UChar32)starterNorm;
      starterNorm._4_4_ = starterNorm._4_4_ + -1;
    }
    _c_1 = Norms::getNorm(&this->norms,c);
    if ((starterNorm._4_4_ == i_00) &&
       ((_c_1 == (Norm *)0x0 || (_c_1->compositions == (UVector32 *)0x0)))) {
      this_local._7_1_ = true;
    }
    else {
      local_41 = 0;
      do {
        while( true ) {
          starterNorm._4_4_ = starterNorm._4_4_ + 1;
          iVar4 = BuilderReorderingBuffer::length(buffer);
          if (iVar4 <= starterNorm._4_4_) {
            if (local_41 == 0) {
              return '\0';
            }
            UVar1 = Norms::combinesWithCCBetween(&this->norms,_c_1,local_41,0x100);
            if (UVar1 != '\0') {
              return '\0';
            }
            return '\x01';
          }
          bVar2 = BuilderReorderingBuffer::ccAt(buffer,starterNorm._4_4_);
          if ((i_00 < starterNorm._4_4_) &&
             (UVar1 = Norms::combinesWithCCBetween(&this->norms,_c_1,local_41,(uint)bVar2),
             UVar1 != '\0')) {
            return '\0';
          }
          UVar5 = BuilderReorderingBuffer::charAt(buffer,starterNorm._4_4_);
          if ((_c_1 != (Norm *)0x0) &&
             ((((local_41 < bVar2 || (local_41 == 0)) &&
               (pNVar6 = Norms::getNormRef(&this->norms,UVar5), pNVar6->combinesBack != '\0')) &&
              (c_00 = Norm::combine(_c_1,UVar5), -1 < c_00)))) break;
          local_41 = bVar2;
          if (bVar2 == 0) {
            _c_1 = Norms::getNorm(&this->norms,UVar5);
            if ((starterNorm._4_4_ == i_00) &&
               ((_c_1 == (Norm *)0x0 || (_c_1->compositions == (UVector32 *)0x0)))) {
              return '\x01';
            }
            local_41 = 0;
          }
        }
        _c_1 = Norms::getNorm(&this->norms,c_00);
      } while ((starterNorm._4_4_ < i_00) ||
              ((_c_1 != (Norm *)0x0 && (_c_1->compositions != (UVector32 *)0x0))));
      this_local._7_1_ = true;
    }
  }
  else {
LAB_0020299d:
    this_local._7_1_ = i_00 != i_01;
  }
  return this_local._7_1_;
}

Assistant:

UBool Normalizer2DataBuilder::mappingHasCompBoundaryAfter(const BuilderReorderingBuffer &buffer,
                                                          Norm::MappingType mappingType) const {
    if(buffer.isEmpty()) {
        return FALSE;  // Maps-to-empty-string is no boundary of any kind.
    }
    int32_t lastStarterIndex=buffer.lastStarterIndex();
    if(lastStarterIndex<0) {
        return FALSE;  // no starter
    }
    const int32_t lastIndex=buffer.length()-1;
    if(mappingType==Norm::ONE_WAY && lastStarterIndex<lastIndex && buffer.ccAt(lastIndex)>1) {
        // One-way mapping where after the last starter is at least one combining mark
        // with a combining class greater than 1,
        // which means that another combining mark can reorder before it.
        // By contrast, in a round-trip mapping this does not prevent a boundary as long as
        // the starter or composite does not combine-forward with a following combining mark.
        return FALSE;
    }
    UChar32 starter=buffer.charAt(lastStarterIndex);
    if(lastStarterIndex==0 && norms.combinesBack(starter)) {
        // The last starter is at the beginning of the mapping and combines backward.
        return FALSE;
    }
    if(Hangul::isJamoL(starter) ||
            (Hangul::isJamoV(starter) &&
            0<lastStarterIndex && Hangul::isJamoL(buffer.charAt(lastStarterIndex-1)))) {
        // A Jamo leading consonant or an LV pair combines-forward if it is at the end,
        // otherwise it is blocked.
        return lastStarterIndex!=lastIndex;
    }
    // Note: There can be no Hangul syllable in the fully decomposed mapping.

    // Multiple starters can combine into one.
    // Look for the first of the last sequence of starters, excluding Jamos.
    int32_t i=lastStarterIndex;
    UChar32 c;
    while(0<i && buffer.ccAt(i-1)==0 && !Hangul::isJamo(c=buffer.charAt(i-1))) {
        starter=c;
        --i;
    }
    // Compose as far as possible, and see if further compositions with
    // characters following this mapping are possible.
    const Norm *starterNorm=norms.getNorm(starter);
    if(i==lastStarterIndex &&
            (starterNorm==nullptr || starterNorm->compositions==nullptr)) {
        return TRUE;  // The last starter does not combine forward.
    }
    uint8_t prevCC=0;
    while(++i<buffer.length()) {
        uint8_t cc=buffer.ccAt(i);  // !=0 if after last starter
        if(i>lastStarterIndex && norms.combinesWithCCBetween(*starterNorm, prevCC, cc)) {
            // The starter combines with a mark that reorders before the current one.
            return FALSE;
        }
        UChar32 c=buffer.charAt(i);
        if(starterNorm!=nullptr && (prevCC<cc || prevCC==0) &&
                norms.getNormRef(c).combinesBack && (starter=starterNorm->combine(c))>=0) {
            // The starter combines with c into a composite replacement starter.
            starterNorm=norms.getNorm(starter);
            if(i>=lastStarterIndex &&
                    (starterNorm==nullptr || starterNorm->compositions==nullptr)) {
                return TRUE;  // The composite does not combine further.
            }
            // Keep prevCC because we "removed" the combining mark.
        } else if(cc==0) {
            starterNorm=norms.getNorm(c);
            if(i==lastStarterIndex &&
                    (starterNorm==nullptr || starterNorm->compositions==nullptr)) {
                return TRUE;  // The new starter does not combine forward.
            }
            prevCC=0;
        } else {
            prevCC=cc;
        }
    }
    if(prevCC==0) {
        return FALSE;  // forward-combining starter at the very end
    }
    if(norms.combinesWithCCBetween(*starterNorm, prevCC, 256)) {
        // The starter combines with another mark.
        return FALSE;
    }
    return TRUE;
}